

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O0

bool __thiscall QPicture::load(QPicture *this,QIODevice *dev)

{
  long lVar1;
  bool bVar2;
  QPicturePrivate *pQVar3;
  long in_FS_OFFSET;
  QByteArray a;
  QPicturePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QPicture *)0x319cbf);
  this_00 = (QPicturePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  pQVar3 = d_func((QPicture *)0x319cf8);
  QBuffer::setData((QByteArray *)&pQVar3->pictb);
  d_func((QPicture *)0x319d13);
  bVar2 = QPicturePrivate::checkFormat(this_00);
  QByteArray::~QByteArray((QByteArray *)0x319d29);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QPicture::load(QIODevice *dev)
{
    detach();
    QByteArray a = dev->readAll();

    d_func()->pictb.setData(a);                        // set byte array in buffer
    return d_func()->checkFormat();
}